

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IAbstractReader.cpp
# Opt level: O0

void __thiscall
IAbstractReader::IAbstractReader
          (IAbstractReader *this,ifstream *ifs,ostream *os,int deep,bool silence)

{
  bool silence_local;
  int deep_local;
  ostream *os_local;
  ifstream *ifs_local;
  IAbstractReader *this_local;
  
  this->_vptr_IAbstractReader = (_func_int **)&PTR___cxa_pure_virtual_001229d8;
  std::__cxx11::string::string((string *)&this->m_dataType);
  this->m_silence = silence;
  this->m_ifs = ifs;
  this->m_deep = deep;
  this->m_os = os;
  std::__cxx11::string::operator=((string *)&this->m_dataType,"Object");
  return;
}

Assistant:

IAbstractReader::IAbstractReader(std::ifstream* ifs, std::ostream* os, int deep,bool silence) {
    m_silence = silence;
    m_ifs = ifs;
    m_deep = deep;
    m_os = os;
    m_dataType = "Object";
}